

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  Fts5Config *pFVar1;
  char **ppcVar2;
  char *zLeft;
  int iVar3;
  int iVar4;
  byte *z;
  Fts5Colset *pFVar5;
  ulong uVar6;
  int in_ECX;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  z = (byte *)sqlite3Fts5Strndup(&pParse->rc,(char *)p,in_ECX);
  if (pParse->rc != 0) goto LAB_001a85cd;
  pFVar1 = pParse->pConfig;
  if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
    fts5Dequote((char *)z);
  }
  iVar4 = pFVar1->nCol;
  if ((long)iVar4 < 1) {
    lVar9 = 0;
LAB_001a8547:
    iVar3 = (int)lVar9;
    if (iVar3 == iVar4) goto LAB_001a854c;
    if (pColset == (Fts5Colset *)0x0) {
      iVar4 = sqlite3_initialize();
      if ((iVar4 == 0) && (pFVar5 = (Fts5Colset *)sqlite3Malloc(8), pFVar5 != (Fts5Colset *)0x0)) {
        uVar8 = 0;
        uVar7 = 0;
        goto LAB_001a8624;
      }
    }
    else {
      uVar7 = pColset->nCol;
      uVar8 = (ulong)uVar7;
      iVar4 = sqlite3_initialize();
      if ((iVar4 == 0) &&
         (pFVar5 = (Fts5Colset *)sqlite3Realloc(pColset,(long)(int)uVar7 * 4 + 8),
         pFVar5 != (Fts5Colset *)0x0)) {
        if (0 < (int)uVar7) {
          uVar6 = 0;
LAB_001a859c:
          if (pFVar5->aiCol[uVar6] != iVar3) {
            if (pFVar5->aiCol[uVar6] <= iVar3) goto code_r0x001a85a9;
            if ((int)uVar6 < (int)uVar7) {
              do {
                pFVar5->aiCol[uVar8] = pFVar5->aiCol[uVar8 - 1];
                uVar8 = uVar8 - 1;
              } while ((long)uVar6 < (long)uVar8);
            }
            uVar8 = uVar6 & 0xffffffff;
            goto LAB_001a8624;
          }
          goto LAB_001a8631;
        }
        uVar8 = 0;
LAB_001a8624:
        pFVar5->aiCol[uVar8] = iVar3;
        pFVar5->nCol = uVar7 + 1;
LAB_001a8631:
        sqlite3_free(z);
        return pFVar5;
      }
    }
    pParse->rc = 7;
  }
  else {
    ppcVar2 = pFVar1->azCol;
    lVar9 = 0;
    do {
      zLeft = ppcVar2[lVar9];
      if ((zLeft != (char *)0x0) && (iVar3 = sqlite3StrICmp(zLeft,(char *)z), iVar3 == 0))
      goto LAB_001a8547;
      lVar9 = lVar9 + 1;
    } while (iVar4 != lVar9);
LAB_001a854c:
    sqlite3Fts5ParseError(pParse,"no such column: %s",z);
  }
  sqlite3_free(z);
LAB_001a85cd:
  sqlite3_free(pColset);
  return (Fts5Colset *)0x0;
code_r0x001a85a9:
  uVar6 = uVar6 + 1;
  if (uVar8 == uVar6) goto LAB_001a8624;
  goto LAB_001a859c;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}